

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall duckdb::Event::Finish(Event *this)

{
  bool bVar1;
  long *in_RDI;
  shared_ptr<duckdb::Event,_true> parent;
  weak_ptr<duckdb::Event,_true> *parent_entry;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::weak_ptr<duckdb::Event,_true>,_true> *__range1;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  Event *in_stack_ffffffffffffffa0;
  weak_ptr<duckdb::Event,_true> *in_stack_ffffffffffffffc8;
  __normal_iterator<duckdb::weak_ptr<duckdb::Event,_true>_*,_std::vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>_>
  local_18;
  long *local_10;
  
  (**(code **)(*in_RDI + 0x18))();
  ::std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffffa0,(bool)in_stack_ffffffffffffff9f);
  local_10 = in_RDI + 8;
  local_18._M_current =
       (weak_ptr<duckdb::Event,_true> *)
       ::std::
       vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
       ::begin((vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  ::std::
  vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
  ::end((vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>
         *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::weak_ptr<duckdb::Event,_true>_*,_std::vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>_>
                             *)in_stack_ffffffffffffffa0,
                            (__normal_iterator<duckdb::weak_ptr<duckdb::Event,_true>_*,_std::vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<duckdb::weak_ptr<duckdb::Event,_true>_*,_std::vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>_>
    ::operator*(&local_18);
    weak_ptr<duckdb::Event,_true>::lock(in_stack_ffffffffffffffc8);
    bVar1 = duckdb::shared_ptr::operator_cast_to_bool((shared_ptr<duckdb::Event,_true> *)0x995408);
    if (bVar1) {
      in_stack_ffffffffffffffa0 =
           shared_ptr<duckdb::Event,_true>::operator->
                     ((shared_ptr<duckdb::Event,_true> *)in_stack_ffffffffffffffa0);
      CompleteDependency(in_stack_ffffffffffffffa0);
    }
    shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x995445);
    __gnu_cxx::
    __normal_iterator<duckdb::weak_ptr<duckdb::Event,_true>_*,_std::vector<duckdb::weak_ptr<duckdb::Event,_true>,_std::allocator<duckdb::weak_ptr<duckdb::Event,_true>_>_>_>
    ::operator++(&local_18);
  }
  (**(code **)(*in_RDI + 0x20))();
  return;
}

Assistant:

void Event::Finish() {
	D_ASSERT(!finished);
	FinishEvent();
	finished = true;
	// finished processing the pipeline, now we can schedule pipelines that depend on this pipeline
	for (auto &parent_entry : parents) {
		auto parent = parent_entry.lock();
		if (!parent) { // LCOV_EXCL_START
			continue;
		} // LCOV_EXCL_STOP
		// mark a dependency as completed for each of the parents
		parent->CompleteDependency();
	}
	FinalizeFinish();
}